

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O2

ngx_int_t ngx_decode_base64_internal(ngx_str_t *dst,ngx_str_t *src,u_char *basis)

{
  ngx_int_t nVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  
  nVar1 = -1;
  for (uVar6 = 0;
      (uVar4 = src->len, src->len != uVar6 && (uVar4 = uVar6, (ulong)src->data[uVar6] != 0x3d));
      uVar6 = uVar6 + 1) {
    if (basis[src->data[uVar6]] == 'M') {
      return -1;
    }
  }
  if (((uint)uVar4 & 3) != 1) {
    pbVar2 = dst->data + 2;
    pbVar5 = src->data + 3;
    for (; 3 < uVar4; uVar4 = uVar4 - 4) {
      pbVar2[-2] = basis[pbVar5[-2]] >> 4 | basis[pbVar5[-3]] << 2;
      pbVar2[-1] = basis[pbVar5[-1]] >> 2 | basis[pbVar5[-2]] << 4;
      *pbVar2 = basis[pbVar5[-1]] << 6 | basis[*pbVar5];
      pbVar2 = pbVar2 + 3;
      pbVar5 = pbVar5 + 4;
    }
    if (uVar4 < 2) {
      pbVar3 = pbVar2 + -2;
    }
    else {
      pbVar3 = pbVar2 + -1;
      pbVar2[-2] = basis[pbVar5[-2]] >> 4 | basis[pbVar5[-3]] << 2;
      if (uVar4 == 3) {
        *pbVar3 = basis[pbVar5[-1]] >> 2 | basis[pbVar5[-2]] << 4;
        pbVar3 = pbVar2;
      }
    }
    dst->len = (long)pbVar3 - (long)dst->data;
    nVar1 = 0;
  }
  return nVar1;
}

Assistant:

static ngx_int_t
ngx_decode_base64_internal(ngx_str_t *dst, ngx_str_t *src, const u_char *basis)
{
    size_t          len;
    u_char         *d, *s;

    for (len = 0; len < src->len; len++) {
        if (src->data[len] == '=') {
            break;
        }

        if (basis[src->data[len]] == 77) {
            return NGX_ERROR;
        }
    }

    if (len % 4 == 1) {
        return NGX_ERROR;
    }

    s = src->data;
    d = dst->data;

    while (len > 3) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
        *d++ = (u_char) (basis[s[2]] << 6 | basis[s[3]]);

        s += 4;
        len -= 4;
    }

    if (len > 1) {
        *d++ = (u_char) (basis[s[0]] << 2 | basis[s[1]] >> 4);
    }

    if (len > 2) {
        *d++ = (u_char) (basis[s[1]] << 4 | basis[s[2]] >> 2);
    }

    dst->len = d - dst->data;

    return NGX_OK;
}